

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,string *path_info,int32_t child_num,bool has_schnorr_pubkey)

{
  pointer pcVar1;
  pointer puVar2;
  void *pvVar3;
  bool bVar4;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __result;
  uint uVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  pointer puVar11;
  CfdException *pCVar12;
  uint uVar13;
  bool bVar14;
  uint __len;
  pointer pbVar15;
  size_t __n;
  ulong uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  ByteData bytes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string hdkey_top;
  string key;
  string key_info;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path_list;
  string base_extkey_;
  undefined1 local_1c8 [40];
  pointer local_1a0;
  pointer puStack_198;
  pointer local_190;
  pointer local_188;
  pointer puStack_180;
  pointer local_178;
  pointer local_170;
  pointer puStack_168;
  pointer local_160;
  pointer local_158;
  string local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  uint local_10c;
  string local_108;
  string local_e8;
  Privkey *local_c8;
  ExtPrivkey *local_c0;
  string local_b8;
  ExtPubkey *local_98;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_90;
  ByteData local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  ByteData *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_10c = child_num;
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  local_c0 = &this->extprivkey_;
  local_c8 = &this->privkey_;
  ExtPrivkey::ExtPrivkey(local_c0);
  local_98 = &this->extpubkey_;
  ExtPubkey::ExtPubkey(local_98);
  local_90.container = &this->path_;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = &this->fingerprint_;
  ByteData::ByteData(local_58);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar1 = (path_info->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + path_info->_M_string_length);
  if ((*(path_info->_M_dataplus)._M_p == '[') &&
     (lVar8 = ::std::__cxx11::string::find((char *)path_info,0x5a87c3,0), lVar8 != -1)) {
    ::std::__cxx11::string::substr((ulong)local_1c8,(ulong)path_info);
    ::std::__cxx11::string::operator=((string *)&local_b8,(string *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_);
    }
    ::std::__cxx11::string::substr((ulong)local_1c8,(ulong)path_info);
    lVar8 = ::std::__cxx11::string::find(local_1c8,0x5824d9,0);
    if (lVar8 != -1) {
      if (lVar8 != 0) {
        ::std::__cxx11::string::substr((ulong)&local_108,(ulong)local_1c8);
        ByteData::ByteData((ByteData *)&local_148,&local_108);
        puVar11 = (this->fingerprint_).data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->fingerprint_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_148._M_dataplus._M_p;
        (this->fingerprint_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_148._M_string_length;
        (this->fingerprint_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_148.field_2._M_allocated_capacity;
        local_148._M_dataplus._M_p = (pointer)0x0;
        local_148._M_string_length = 0;
        local_148.field_2._M_allocated_capacity = 0;
        if ((puVar11 != (pointer)0x0) &&
           (operator_delete(puVar11),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_148._M_dataplus._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
      }
      ::std::__cxx11::string::substr((ulong)&local_108,(ulong)local_1c8);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"KeyData","");
      ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,&local_108,
                        &local_148,'\0');
      puVar2 = (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_e8._M_dataplus._M_p;
      (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_e8._M_string_length;
      (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_e8.field_2._M_allocated_capacity;
      local_e8._M_dataplus._M_p = (pointer)0x0;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_allocated_capacity = 0;
      if ((puVar2 != (pointer)0x0) &&
         (operator_delete(puVar2),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_e8._M_dataplus._M_p !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
    }
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_);
    }
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  if (4 < local_b8._M_string_length) {
    ::std::__cxx11::string::substr((ulong)local_1c8,(ulong)&local_b8);
    ::std::__cxx11::string::operator=((string *)&local_108,(string *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_);
    }
  }
  iVar7 = ::std::__cxx11::string::compare((char *)&local_108);
  if ((iVar7 == 0) || (iVar7 = ::std::__cxx11::string::compare((char *)&local_108), iVar7 == 0)) {
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity =
         local_148.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity =
         local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1c8._0_8_ = local_1c8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"/","");
    StringUtil::Split(&local_128,(string *)&local_b8,(string *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_);
    }
    ::std::__cxx11::string::_M_assign((string *)&local_e8);
    if ((ulong)((long)local_128.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_128.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      bVar6 = false;
    }
    else {
      uVar16 = 1;
      lVar8 = 0x20;
      bVar6 = false;
      do {
        if (uVar16 == 1) {
          pbVar15 = local_128.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        else {
          ::std::__cxx11::string::append((char *)&local_148);
          pbVar15 = (pointer)((long)&((local_128.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar8);
        }
        iVar7 = ::std::__cxx11::string::compare((char *)pbVar15);
        if (iVar7 == 0) {
          bVar14 = false;
          goto LAB_0042e8bb;
        }
        iVar7 = ::std::__cxx11::string::compare
                          ((char *)((long)&((local_128.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar8));
        bVar14 = true;
        if (((iVar7 == 0) ||
            (iVar7 = ::std::__cxx11::string::compare
                               ((char *)((long)&((local_128.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar8)), iVar7 == 0)) ||
           (iVar7 = ::std::__cxx11::string::compare
                              ((char *)((long)&((local_128.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar8)), iVar7 == 0)) {
          bVar6 = true;
          goto LAB_0042e8bb;
        }
        ::std::__cxx11::string::_M_append
                  ((char *)&local_148,
                   *(ulong *)((long)&((local_128.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar8));
        lVar9 = ::std::__cxx11::string::find
                          ((char *)((long)&((local_128.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar8),0x583faf,0);
        bVar14 = true;
        if (((lVar9 == -1) &&
            (lVar9 = ::std::__cxx11::string::find
                               ((char *)((long)&((local_128.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar8),0x583fb2,0), lVar9 == -1)
            ) && (lVar9 = ::std::__cxx11::string::find
                                    ((char *)((long)&((local_128.
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar8),0x585867,0),
                 lVar9 == -1)) {
          uVar10 = strtoul(*(char **)((long)&((local_128.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar8),(char **)0x0,0);
          bVar14 = (bool)(0x7fffffff < uVar10 | bVar6);
        }
        bVar6 = bVar14;
        uVar16 = uVar16 + 1;
        lVar8 = lVar8 + 0x20;
      } while (uVar16 < (ulong)((long)local_128.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_128.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
      bVar14 = false;
LAB_0042e8bb:
      if (uVar16 + 1 <
          (ulong)((long)local_128.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_128.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        local_1c8._0_8_ = "cfdcore_hdwallet.cpp";
        local_1c8._8_4_ = 0x4c6;
        local_1c8._16_8_ = (long)"AnalyzeBip32KeyData" + 0xc;
        logger::log<>((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                      "Failed to extkey path. A \'*\' can only be specified at the end.");
        pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1c8._0_8_ = local_1c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,
                   "Failed to extkey path. A \'*\' can only be specified at the end.","");
        CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_1c8);
        __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
      }
      lVar8 = ::std::__cxx11::string::find
                        ((char *)(local_128.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1),0x4ddb5c,0);
      if (lVar8 != -1) {
        if ((int)local_10c < 0) {
          local_1c8._0_8_ = "cfdcore_hdwallet.cpp";
          local_1c8._8_4_ = 0x4d1;
          local_1c8._16_8_ = (long)"AnalyzeBip32KeyData" + 0xc;
          logger::log<>((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                        "Failed to extkey path. A \'*\' can not support.");
          pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
          local_1c8._0_8_ = local_1c8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"Failed to extkey path. A \'*\' can not support.","");
          CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_1c8);
          __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
        }
        __len = 1;
        if (9 < local_10c) {
          uVar5 = 4;
          uVar13 = local_10c;
          do {
            __len = uVar5;
            if (uVar13 < 100) {
              __len = __len - 2;
              goto LAB_0042ea90;
            }
            if (uVar13 < 1000) {
              __len = __len - 1;
              goto LAB_0042ea90;
            }
            if (uVar13 < 10000) goto LAB_0042ea90;
            bVar4 = 99999 < uVar13;
            uVar5 = __len + 4;
            uVar13 = uVar13 / 10000;
          } while (bVar4);
          __len = __len + 1;
        }
LAB_0042ea90:
        local_1c8._0_8_ = local_1c8 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_1c8,(char)__len);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1c8._0_8_,__len,local_10c);
        ::std::__cxx11::string::_M_append((char *)&local_148,local_1c8._0_8_);
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_);
        }
        if (bVar14) {
          ::std::__cxx11::string::append((char *)&local_148);
        }
      }
    }
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    iVar7 = ::std::__cxx11::string::compare((char *)&local_108);
    if (iVar7 == 0) {
      ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_1c8,&local_e8);
      puVar11 = (this->extprivkey_).serialize_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
      (this->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
      (this->extprivkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
      local_1c8._0_8_ = (pointer)0x0;
      local_1c8._8_8_ = (pointer)0x0;
      local_1c8._16_8_ = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      (this->extprivkey_).version_ = local_1c8._24_4_;
      (this->extprivkey_).fingerprint_ = local_1c8._28_4_;
      (this->extprivkey_).depth_ = local_1c8[0x20];
      *(undefined3 *)&(this->extprivkey_).field_0x21 = local_1c8._33_3_;
      (this->extprivkey_).child_num_ = local_1c8._36_4_;
      puVar11 = (this->extprivkey_).chaincode_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1a0;
      (this->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_198;
      (this->extprivkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_190;
      local_1a0 = (pointer)0x0;
      puStack_198 = (pointer)0x0;
      local_190 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = (this->extprivkey_).privkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extprivkey_).privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_188;
      *(pointer *)
       ((long)&(this->extprivkey_).privkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8) = puStack_180;
      *(pointer *)
       ((long)&(this->extprivkey_).privkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 0x10) = local_178;
      local_188 = (pointer)0x0;
      puStack_180 = (pointer)0x0;
      local_178 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      *(pointer *)&(this->extprivkey_).privkey_.is_compressed_ = local_170;
      puVar11 = (this->extprivkey_).tweak_sum_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puStack_168;
      (this->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = local_160;
      (this->extprivkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_158;
      puStack_168 = (pointer)0x0;
      local_160 = (pointer)0x0;
      local_158 = (pointer)0x0;
      if ((puVar11 != (pointer)0x0) && (operator_delete(puVar11), puStack_168 != (pointer)0x0)) {
        operator_delete(puStack_168);
      }
      if (local_188 != (pointer)0x0) {
        operator_delete(local_188);
      }
      if (local_1a0 != (pointer)0x0) {
        operator_delete(local_1a0);
      }
      if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1c8._0_8_);
      }
      if ((pointer)local_148._M_string_length != (pointer)0x0) {
        ExtPrivkey::DerivePrivkey((ExtPrivkey *)local_1c8,local_c0,&local_148);
        puVar11 = (this->extprivkey_).serialize_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->extprivkey_).serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
        (this->extprivkey_).serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
        (this->extprivkey_).serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
        local_1c8._0_8_ = (pointer)0x0;
        local_1c8._8_8_ = (pointer)0x0;
        local_1c8._16_8_ = (pointer)0x0;
        if (puVar11 != (pointer)0x0) {
          operator_delete(puVar11);
        }
        (this->extprivkey_).version_ = local_1c8._24_4_;
        (this->extprivkey_).fingerprint_ = local_1c8._28_4_;
        (this->extprivkey_).depth_ = local_1c8[0x20];
        *(undefined3 *)&(this->extprivkey_).field_0x21 = local_1c8._33_3_;
        (this->extprivkey_).child_num_ = local_1c8._36_4_;
        puVar11 = (this->extprivkey_).chaincode_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->extprivkey_).chaincode_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_1a0;
        (this->extprivkey_).chaincode_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puStack_198;
        (this->extprivkey_).chaincode_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_190;
        local_1a0 = (pointer)0x0;
        puStack_198 = (pointer)0x0;
        local_190 = (pointer)0x0;
        if (puVar11 != (pointer)0x0) {
          operator_delete(puVar11);
        }
        puVar11 = (this->extprivkey_).privkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->extprivkey_).privkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_188;
        *(pointer *)
         ((long)&(this->extprivkey_).privkey_.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8) = puStack_180;
        *(pointer *)
         ((long)&(this->extprivkey_).privkey_.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 0x10) = local_178;
        local_188 = (pointer)0x0;
        puStack_180 = (pointer)0x0;
        local_178 = (pointer)0x0;
        if (puVar11 != (pointer)0x0) {
          operator_delete(puVar11);
        }
        *(pointer *)&(this->extprivkey_).privkey_.is_compressed_ = local_170;
        puVar11 = (this->extprivkey_).tweak_sum_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->extprivkey_).tweak_sum_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = puStack_168;
        (this->extprivkey_).tweak_sum_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = local_160;
        (this->extprivkey_).tweak_sum_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_158;
        puStack_168 = (pointer)0x0;
        local_160 = (pointer)0x0;
        local_158 = (pointer)0x0;
        if ((puVar11 != (pointer)0x0) && (operator_delete(puVar11), puStack_168 != (pointer)0x0)) {
          operator_delete(puStack_168);
        }
        if (local_188 != (pointer)0x0) {
          operator_delete(local_188);
        }
        if (local_1a0 != (pointer)0x0) {
          operator_delete(local_1a0);
        }
        if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1c8._0_8_);
        }
      }
      ExtPrivkey::GetExtPubkey((ExtPubkey *)local_1c8,local_c0);
      puVar11 = (this->extpubkey_).serialize_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
      (this->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
      (this->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
      local_1c8._0_8_ = (pointer)0x0;
      local_1c8._8_8_ = (pointer)0x0;
      local_1c8._16_8_ = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      (this->extpubkey_).version_ = local_1c8._24_4_;
      (this->extpubkey_).fingerprint_ = local_1c8._28_4_;
      (this->extpubkey_).depth_ = local_1c8[0x20];
      *(undefined3 *)&(this->extpubkey_).field_0x21 = local_1c8._33_3_;
      (this->extpubkey_).child_num_ = local_1c8._36_4_;
      puVar11 = (this->extpubkey_).chaincode_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1a0;
      (this->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_198;
      (this->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_190;
      local_1a0 = (pointer)0x0;
      puStack_198 = (pointer)0x0;
      local_190 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = (this->extpubkey_).pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extpubkey_).pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_188;
      *(pointer *)
       ((long)&(this->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8) = puStack_180;
      *(pointer *)
       ((long)&(this->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 0x10) = local_178;
      local_188 = (pointer)0x0;
      puStack_180 = (pointer)0x0;
      local_178 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = (this->extpubkey_).tweak_sum_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_170;
      (this->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_168;
      (this->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_160;
      local_170 = (pointer)0x0;
      puStack_168 = (pointer)0x0;
      local_160 = (pointer)0x0;
      if ((puVar11 != (pointer)0x0) && (operator_delete(puVar11), local_170 != (pointer)0x0)) {
        operator_delete(local_170);
      }
      if (local_188 != (pointer)0x0) {
        operator_delete(local_188);
      }
      if (local_1a0 != (pointer)0x0) {
        operator_delete(local_1a0);
      }
      if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1c8._0_8_);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &(this->extprivkey_).privkey_);
      local_1c8[0x18] = (this->extprivkey_).privkey_.is_compressed_;
      local_1c8._25_3_ = *(undefined3 *)&(this->extprivkey_).privkey_.field_0x19;
      local_1c8._28_4_ = (this->extprivkey_).privkey_.net_type_;
      puVar11 = (this->privkey_).data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
      (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
      (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
      local_1c8._0_8_ = (pointer)0x0;
      local_1c8._8_8_ = (pointer)0x0;
      local_1c8._16_8_ = (pointer)0x0;
      if (puVar11 == (pointer)0x0) {
        (this->privkey_).is_compressed_ = (bool)local_1c8[0x18];
        *(undefined3 *)&(this->privkey_).field_0x19 = local_1c8._25_3_;
        (this->privkey_).net_type_ = local_1c8._28_4_;
      }
      else {
        operator_delete(puVar11);
        (this->privkey_).is_compressed_ = (bool)local_1c8[0x18];
        *(undefined3 *)&(this->privkey_).field_0x19 = local_1c8._25_3_;
        (this->privkey_).net_type_ = local_1c8._28_4_;
        if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1c8._0_8_);
        }
      }
      Privkey::GetPubkey((Pubkey *)local_1c8,local_c8);
    }
    else {
      if (bVar6) {
        local_1c8._0_8_ = "cfdcore_hdwallet.cpp";
        local_1c8._8_4_ = 0x4e6;
        local_1c8._16_8_ = (long)"AnalyzeBip32KeyData" + 0xc;
        logger::log<>((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                      "Failed to extPubkey. hardened is extPrivkey only.");
        pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1c8._0_8_ = local_1c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Failed to extPubkey. hardened is extPrivkey only.","");
        CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_1c8);
        __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ExtPubkey::ExtPubkey((ExtPubkey *)local_1c8,&local_e8);
      puVar11 = (this->extpubkey_).serialize_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
      (this->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
      (this->extpubkey_).serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
      local_1c8._0_8_ = (pointer)0x0;
      local_1c8._8_8_ = (pointer)0x0;
      local_1c8._16_8_ = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      (this->extpubkey_).version_ = local_1c8._24_4_;
      (this->extpubkey_).fingerprint_ = local_1c8._28_4_;
      (this->extpubkey_).depth_ = local_1c8[0x20];
      *(undefined3 *)&(this->extpubkey_).field_0x21 = local_1c8._33_3_;
      (this->extpubkey_).child_num_ = local_1c8._36_4_;
      puVar11 = (this->extpubkey_).chaincode_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1a0;
      (this->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_198;
      (this->extpubkey_).chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_190;
      local_1a0 = (pointer)0x0;
      puStack_198 = (pointer)0x0;
      local_190 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = (this->extpubkey_).pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extpubkey_).pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_188;
      *(pointer *)
       ((long)&(this->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8) = puStack_180;
      *(pointer *)
       ((long)&(this->extpubkey_).pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 0x10) = local_178;
      local_188 = (pointer)0x0;
      puStack_180 = (pointer)0x0;
      local_178 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = (this->extpubkey_).tweak_sum_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_170;
      (this->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_168;
      (this->extpubkey_).tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_160;
      local_170 = (pointer)0x0;
      puStack_168 = (pointer)0x0;
      local_160 = (pointer)0x0;
      if ((puVar11 != (pointer)0x0) && (operator_delete(puVar11), local_170 != (pointer)0x0)) {
        operator_delete(local_170);
      }
      if (local_188 != (pointer)0x0) {
        operator_delete(local_188);
      }
      if (local_1a0 != (pointer)0x0) {
        operator_delete(local_1a0);
      }
      if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1c8._0_8_);
      }
      if ((pointer)local_148._M_string_length != (pointer)0x0) {
        ExtPubkey::DerivePubkey((ExtPubkey *)local_1c8,local_98,&local_148);
        puVar11 = (this->extpubkey_).serialize_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->extpubkey_).serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
        (this->extpubkey_).serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
        (this->extpubkey_).serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
        local_1c8._0_8_ = (pointer)0x0;
        local_1c8._8_8_ = (pointer)0x0;
        local_1c8._16_8_ = (pointer)0x0;
        if (puVar11 != (pointer)0x0) {
          operator_delete(puVar11);
        }
        (this->extpubkey_).version_ = local_1c8._24_4_;
        (this->extpubkey_).fingerprint_ = local_1c8._28_4_;
        (this->extpubkey_).depth_ = local_1c8[0x20];
        *(undefined3 *)&(this->extpubkey_).field_0x21 = local_1c8._33_3_;
        (this->extpubkey_).child_num_ = local_1c8._36_4_;
        puVar11 = (this->extpubkey_).chaincode_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->extpubkey_).chaincode_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_1a0;
        (this->extpubkey_).chaincode_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puStack_198;
        (this->extpubkey_).chaincode_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_190;
        local_1a0 = (pointer)0x0;
        puStack_198 = (pointer)0x0;
        local_190 = (pointer)0x0;
        if (puVar11 != (pointer)0x0) {
          operator_delete(puVar11);
        }
        puVar11 = (this->extpubkey_).pubkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->extpubkey_).pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_188;
        *(pointer *)
         ((long)&(this->extpubkey_).pubkey_.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8) = puStack_180;
        *(pointer *)
         ((long)&(this->extpubkey_).pubkey_.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 0x10) = local_178;
        local_188 = (pointer)0x0;
        puStack_180 = (pointer)0x0;
        local_178 = (pointer)0x0;
        if (puVar11 != (pointer)0x0) {
          operator_delete(puVar11);
        }
        puVar11 = (this->extpubkey_).tweak_sum_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->extpubkey_).tweak_sum_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_170;
        (this->extpubkey_).tweak_sum_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puStack_168;
        (this->extpubkey_).tweak_sum_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_160;
        local_170 = (pointer)0x0;
        puStack_168 = (pointer)0x0;
        local_160 = (pointer)0x0;
        if ((puVar11 != (pointer)0x0) && (operator_delete(puVar11), local_170 != (pointer)0x0)) {
          operator_delete(local_170);
        }
        if (local_188 != (pointer)0x0) {
          operator_delete(local_188);
        }
        if (local_1a0 != (pointer)0x0) {
          operator_delete(local_1a0);
        }
        if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1c8._0_8_);
        }
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &(this->extpubkey_).pubkey_);
    }
    pvVar3 = (this->pubkey_).data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
    (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
    (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
    local_1c8._0_8_ = (pointer)0x0;
    local_1c8._8_8_ = (pointer)0x0;
    local_1c8._16_8_ = (pointer)0x0;
    if ((pvVar3 != (void *)0x0) &&
       (operator_delete(pvVar3), (pointer)local_1c8._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_1c8._0_8_);
    }
    if ((pointer)local_148._M_string_length != (pointer)0x0) {
      local_1c8._0_8_ = local_1c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"KeyData","");
      ToArrayFromString(&local_70,&local_148,(string *)local_1c8,'\0');
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_);
      }
      __result.container = local_90.container;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (local_90.container,
                 ((long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) +
                 ((long)(this->path_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->path_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2));
      ::std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_int*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,__result);
      if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == &local_148.field_2) goto LAB_0042f356;
  }
  else {
    bVar6 = Privkey::HasWif(&local_b8,(NetType *)0x0,(bool *)0x0);
    if (bVar6) {
      Privkey::FromWif((Privkey *)local_1c8,&local_b8,kCustomChain,true);
      puVar11 = (this->privkey_).data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
      (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
      (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
      local_1c8._0_8_ = (pointer)0x0;
      local_1c8._8_8_ = (pointer)0x0;
      local_1c8._16_8_ = (pointer)0x0;
      if (puVar11 == (pointer)0x0) {
        (this->privkey_).is_compressed_ = (bool)local_1c8[0x18];
        *(undefined3 *)&(this->privkey_).field_0x19 = local_1c8._25_3_;
        (this->privkey_).net_type_ = local_1c8._28_4_;
      }
      else {
        operator_delete(puVar11);
        (this->privkey_).is_compressed_ = (bool)local_1c8[0x18];
        *(undefined3 *)&(this->privkey_).field_0x19 = local_1c8._25_3_;
        (this->privkey_).net_type_ = local_1c8._28_4_;
        if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1c8._0_8_);
        }
      }
      Privkey::GetPubkey((Pubkey *)local_1c8,local_c8);
      pvVar3 = (this->pubkey_).data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
      local_1c8._0_8_ = (pointer)0x0;
      local_1c8._8_8_ = (pointer)0x0;
      local_1c8._16_8_ = (pointer)0x0;
      if ((pvVar3 != (void *)0x0) &&
         (operator_delete(pvVar3), (pointer)local_1c8._0_8_ != (pointer)0x0)) {
        operator_delete((void *)local_1c8._0_8_);
      }
      goto LAB_0042f356;
    }
    ByteData::ByteData((ByteData *)&local_148,&local_b8);
    bVar6 = Pubkey::IsValid((ByteData *)&local_148);
    if (bVar6) {
      local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar16 = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
      if (uVar16 == 0) {
        puVar11 = (pointer)0x0;
        __n = 0;
      }
      else {
        if ((long)uVar16 < 0) {
          ::std::__throw_bad_alloc();
        }
        puVar11 = (pointer)operator_new(uVar16);
        __n = local_148._M_string_length - (long)local_148._M_dataplus._M_p;
      }
      local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar11 + uVar16;
      local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar11;
      if ((pointer)local_148._M_string_length != local_148._M_dataplus._M_p) {
        local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar11;
        memmove(puVar11,local_148._M_dataplus._M_p,__n);
      }
      local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar11 + __n;
      Pubkey::Pubkey((Pubkey *)local_1c8,&local_88);
      pvVar3 = (this->pubkey_).data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
      local_1c8._0_8_ = (pointer)0x0;
      local_1c8._8_8_ = (pointer)0x0;
      local_1c8._16_8_ = (pointer)0x0;
      puVar11 = local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar3 != (void *)0x0) &&
         (operator_delete(pvVar3),
         puVar11 = local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
         (pointer)local_1c8._0_8_ != (pointer)0x0)) {
        operator_delete((void *)local_1c8._0_8_);
        puVar11 = local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
LAB_0042ea6e:
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
    }
    else {
      if (has_schnorr_pubkey) {
        SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_1c8,(ByteData *)&local_148);
        SchnorrPubkey::CreatePubkey((Pubkey *)&local_e8,(SchnorrPubkey *)local_1c8,false);
        pvVar3 = (this->pubkey_).data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (this->pubkey_).data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_e8._M_dataplus._M_p;
        (this->pubkey_).data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_e8._M_string_length;
        (this->pubkey_).data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_e8.field_2._M_allocated_capacity;
        local_e8._M_dataplus._M_p = (pointer)0x0;
        local_e8._M_string_length = 0;
        local_e8.field_2._M_allocated_capacity = 0;
        puVar11 = (pointer)local_1c8._0_8_;
        if ((pvVar3 != (void *)0x0) &&
           (operator_delete(pvVar3), puVar11 = (pointer)local_1c8._0_8_,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_e8._M_dataplus._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          operator_delete(local_e8._M_dataplus._M_p);
          puVar11 = (pointer)local_1c8._0_8_;
        }
        goto LAB_0042ea6e;
      }
      Privkey::Privkey((Privkey *)local_1c8,(ByteData *)&local_148,kMainnet,true);
      puVar11 = (this->privkey_).data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
      (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
      (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
      local_1c8._0_8_ = (pointer)0x0;
      local_1c8._8_8_ = (pointer)0x0;
      local_1c8._16_8_ = (pointer)0x0;
      if (puVar11 == (pointer)0x0) {
        (this->privkey_).is_compressed_ = (bool)local_1c8[0x18];
        *(undefined3 *)&(this->privkey_).field_0x19 = local_1c8._25_3_;
        (this->privkey_).net_type_ = local_1c8._28_4_;
      }
      else {
        operator_delete(puVar11);
        (this->privkey_).is_compressed_ = (bool)local_1c8[0x18];
        *(undefined3 *)&(this->privkey_).field_0x19 = local_1c8._25_3_;
        (this->privkey_).net_type_ = local_1c8._28_4_;
        if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1c8._0_8_);
        }
      }
      Privkey::GetPubkey((Pubkey *)local_1c8,local_c8);
      pvVar3 = (this->pubkey_).data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._0_8_;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
      (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._16_8_;
      local_1c8._0_8_ = (pointer)0x0;
      local_1c8._8_8_ = (pointer)0x0;
      local_1c8._16_8_ = (pointer)0x0;
      if ((pvVar3 != (void *)0x0) &&
         (operator_delete(pvVar3), (pointer)local_1c8._0_8_ != (pointer)0x0)) {
        operator_delete((void *)local_1c8._0_8_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0042f356;
  }
  operator_delete(local_148._M_dataplus._M_p);
LAB_0042f356:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

KeyData::KeyData(
    const std::string& path_info, int32_t child_num, bool has_schnorr_pubkey) {
  auto key_info = path_info;
  if (path_info[0] == '[') {
    // key origin information check. cut to ']'
    auto pos = path_info.find("]");
    if (pos != std::string::npos) {
      key_info = path_info.substr(pos + 1);
      auto path = path_info.substr(1, pos - 1);
      pos = path.find("/");
      if (pos != std::string::npos) {
        if (pos != 0) {
          auto fingerprint = path.substr(0, pos);
          fingerprint_ = ByteData(fingerprint);
        }
        auto child_path = path.substr(pos + 1);
        path_ = ToArrayFromString(child_path, "KeyData", 0);
      }
    }
  }
  // derive key check (xpub,etc)D
  std::string hdkey_top;
  if (key_info.size() > 4) hdkey_top = key_info.substr(1, 3);
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    std::string path;
    std::string key;
    bool has_end_any_hardened = false;
    bool exist_hardened = false;
    std::vector<std::string> list = StringUtil::Split(key_info, "/");
    key = list[0];
    if (list.size() > 1) {
      size_t index;
      for (index = 1; index < list.size(); ++index) {
        if (index != 1) path += "/";
        if (list[index] == "*") break;
        if ((list[index] == "*'") || (list[index] == "*h") ||
            (list[index] == "*H")) {
          has_end_any_hardened = true;
          exist_hardened = true;
          break;
        }
        path += list[index];
        if ((list[index].find("'") != std::string::npos) ||
            (list[index].find("h") != std::string::npos) ||
            (list[index].find("H") != std::string::npos)) {
          exist_hardened = true;
        } else {
          auto value = strtoul(list[index].c_str(), nullptr, 0);
          if (value >= 0x80000000) exist_hardened = true;
        }
      }
      if ((index + 1) < list.size()) {
        warn(
            CFD_LOG_SOURCE,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
      }
      if (list.back().find("*") != std::string::npos) {
        if (child_num < 0) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to extkey path. "
              "A '*' can not support.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to extkey path. "
              "A '*' can not support.");
        }
        path += std::to_string(child_num);
        if (has_end_any_hardened) path += "h";
      }
    }
    std::string base_extkey_;
    if (hdkey_top == "prv") {
      extprivkey_ = ExtPrivkey(key);
      if (!path.empty()) extprivkey_ = extprivkey_.DerivePrivkey(path);
      extpubkey_ = extprivkey_.GetExtPubkey();
      privkey_ = extprivkey_.GetPrivkey();
      pubkey_ = privkey_.GetPubkey();
    } else if (exist_hardened) {
      warn(
          CFD_LOG_SOURCE, "Failed to extPubkey. hardened is extPrivkey only.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to extPubkey. hardened is extPrivkey only.");
    } else {
      extpubkey_ = ExtPubkey(key);
      if (!path.empty()) extpubkey_ = extpubkey_.DerivePubkey(path);
      pubkey_ = extpubkey_.GetPubkey();
    }
    if (!path.empty()) {
      auto path_list = ToArrayFromString(path, "KeyData", 0);
      path_.reserve(path_.size() + path_list.size());
      std::copy(path_list.begin(), path_list.end(), std::back_inserter(path_));
    }
  } else if (Privkey::HasWif(key_info)) {
    privkey_ = Privkey::FromWif(key_info);
    pubkey_ = privkey_.GetPubkey();
  } else {
    ByteData bytes(key_info);
    if (Pubkey::IsValid(bytes)) {
      pubkey_ = Pubkey(bytes);
    } else if (has_schnorr_pubkey) {
      SchnorrPubkey schnorr_pubkey(bytes);
      pubkey_ = schnorr_pubkey.CreatePubkey();
    } else {
      privkey_ = Privkey(bytes);
      pubkey_ = privkey_.GetPubkey();
    }
  }
}